

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

char * preprocessor_nexttoken(Preprocessor *ctx,uint *len,Token *token)

{
  Preprocessor *__s;
  char cVar1;
  IncludeState *pIVar2;
  int *piVar3;
  Conditional *pCVar4;
  long lVar5;
  bool bVar6;
  byte bVar7;
  Token TVar8;
  int iVar9;
  uint uVar10;
  undefined4 uVar11;
  int iVar12;
  byte *__s1;
  void *__dest;
  Buffer *buffer;
  size_t sVar13;
  undefined8 *puVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  byte *pbVar19;
  long lVar20;
  Preprocessor *pPVar21;
  IncludeState *pIVar22;
  char *pcVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  void *local_d8;
  char *local_c0;
  undefined8 local_98 [13];
  
  bVar27 = 0;
  __s = ctx + 8;
  do {
    if (*(int *)ctx != 0) {
      *(undefined4 *)ctx = 0;
      *token = TOKEN_PREPROCESSING_ERROR;
      sVar15 = strlen((char *)__s);
      *len = (uint)sVar15;
      return (char *)__s;
    }
    pIVar2 = *(IncludeState **)(ctx + 0x120);
    if (pIVar2 == (IncludeState *)0x0) {
      *token = TOKEN_EOI;
      *len = 0;
      bVar6 = false;
      local_c0 = (char *)0x0;
      goto LAB_0012f6db;
    }
    if (pIVar2->conditional_stack == (Conditional *)0x0) {
      bVar26 = false;
    }
    else {
      bVar26 = pIVar2->conditional_stack->skipping != 0;
    }
    if (pIVar2->pushedback == 0) {
      TVar8 = preprocessor_lexer(pIVar2);
    }
    else {
      pIVar2->pushedback = 0;
      TVar8 = pIVar2->tokenval;
    }
    if (TVar8 != TOKEN_IDENTIFIER) {
      *(undefined4 *)(ctx + 0x108) = 0;
      switch(TVar8) {
      case TOKEN_EOI:
        if (pIVar2->bytes_left != 0) {
          __assert_fail("state->bytes_left == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x7f7,
                        "const char *_preprocessor_nexttoken(Preprocessor *, unsigned int *, Token *)"
                       );
        }
        if (pIVar2->conditional_stack == (Conditional *)0x0) {
          pop_source((Context_conflict1 *)ctx);
        }
        else {
          lVar20 = *(long *)(ctx + 0x120);
          piVar3 = *(int **)(lVar20 + 0x50);
          if (4 < *piVar3 - 0x124U) {
            __assert_fail("0 && \"Shouldn\'t hit this case\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x7c2,"void unterminated_pp_condition(Context *)");
          }
          failf((Context_conflict1 *)ctx,"%s",
                &DAT_0013d5b4 + *(int *)(&DAT_0013d5b4 + (ulong)(*piVar3 - 0x124U) * 4));
          *(undefined8 *)(lVar20 + 0x50) = *(undefined8 *)(piVar3 + 4);
          *(undefined8 *)(piVar3 + 4) = *(undefined8 *)(ctx + 0x118);
          *(int **)(ctx + 0x118) = piVar3;
        }
        goto LAB_0012f605;
      default:
        goto switchD_0012f1b8_caseD_11e;
      case TOKEN_PP_IF:
        lVar20 = *(long *)(ctx + 0x120);
        iVar9 = reduce_pp_expression((Context_conflict1 *)ctx);
        bVar6 = true;
        if (iVar9 != -1) {
          puVar14 = *(undefined8 **)(ctx + 0x118);
          if (puVar14 == (undefined8 *)0x0) {
            puVar14 = (undefined8 *)(**(code **)(ctx + 0x960))(0x18,*(undefined8 *)(ctx + 0x970));
            if (puVar14 == (undefined8 *)0x0) {
              *(undefined4 *)(ctx + 4) = 1;
            }
          }
          else {
            *(undefined8 *)(ctx + 0x118) = puVar14[2];
          }
          bVar6 = true;
          if (puVar14 == (undefined8 *)0x0) {
            if (*(int *)(ctx + 4) == 0) {
              __assert_fail("(conditional != NULL) || (ctx->out_of_memory)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x765,"Conditional *handle_pp_if(Context *)");
            }
          }
          else {
            *puVar14 = 0;
            puVar14[1] = 0;
            puVar14[2] = 0;
            lVar5 = *(long *)(lVar20 + 0x50);
            if ((lVar5 == 0) || (uVar24 = 1, *(int *)(lVar5 + 8) == 0)) {
              uVar24 = (uint)(iVar9 == 0);
            }
            *(undefined4 *)puVar14 = 0x124;
            *(int *)((long)puVar14 + 4) = *(int *)(lVar20 + 0x4c) + -1;
            *(uint *)(puVar14 + 1) = uVar24;
            *(int *)((long)puVar14 + 0xc) = iVar9;
            puVar14[2] = lVar5;
            *(undefined8 **)(lVar20 + 0x50) = puVar14;
          }
        }
        break;
      case TOKEN_PP_IFDEF:
        TVar8 = TOKEN_PP_IFDEF;
        goto LAB_0012f356;
      case TOKEN_PP_IFNDEF:
        TVar8 = TOKEN_PP_IFNDEF;
LAB_0012f356:
        _handle_pp_ifdef((Context_conflict1 *)ctx,TVar8);
        goto LAB_0012f6d8;
      case TOKEN_PP_ELSE:
        pCVar4 = (*(IncludeState **)(ctx + 0x120))->conditional_stack;
        iVar9 = require_newline(*(IncludeState **)(ctx + 0x120));
        if (iVar9 == 0) {
          pcVar23 = "Invalid #else directive";
        }
        else if (pCVar4 == (Conditional *)0x0) {
          pcVar23 = "#else without #if";
        }
        else {
          if (pCVar4->type != TOKEN_PP_ELSE) {
            pCVar4->type = TOKEN_PP_ELSE;
            if ((pCVar4->next == (Conditional *)0x0) || (uVar24 = 1, pCVar4->next->skipping == 0)) {
              uVar24 = (uint)(pCVar4->chosen != 0);
            }
            pCVar4->skipping = uVar24;
            bVar6 = true;
            if (pCVar4->chosen == 0) {
              pCVar4->chosen = 1;
            }
            break;
          }
          pcVar23 = "#else after #else";
        }
        goto LAB_0012f6d1;
      case TOKEN_PP_ELIF:
        iVar9 = reduce_pp_expression((Context_conflict1 *)ctx);
        bVar6 = true;
        if (iVar9 != -1) {
          piVar3 = *(int **)(*(long *)(ctx + 0x120) + 0x50);
          if (piVar3 == (int *)0x0) {
            pcVar23 = "#elif without #if";
          }
          else {
            if (*piVar3 != 0x127) {
              *piVar3 = 0x128;
              if (((*(long *)(piVar3 + 4) == 0) ||
                  (uVar24 = 1, *(int *)(*(long *)(piVar3 + 4) + 8) == 0)) &&
                 (uVar24 = 1, piVar3[3] == 0)) {
                uVar24 = (uint)(iVar9 == 0);
              }
              piVar3[2] = uVar24;
              if (piVar3[3] == 0) {
                piVar3[3] = iVar9;
              }
              break;
            }
            pcVar23 = "#elif after #else";
          }
          goto LAB_0012f6d1;
        }
        break;
      case TOKEN_PP_ENDIF:
        pIVar2 = *(IncludeState **)(ctx + 0x120);
        pCVar4 = pIVar2->conditional_stack;
        iVar9 = require_newline(pIVar2);
        if (iVar9 == 0) {
          pcVar23 = "Invalid #endif directive";
        }
        else {
          if (pCVar4 != (Conditional *)0x0) {
            pIVar2->conditional_stack = pCVar4->next;
            pCVar4->next = *(Conditional **)(ctx + 0x118);
            *(Conditional **)(ctx + 0x118) = pCVar4;
            goto LAB_0012f605;
          }
          pcVar23 = "Unmatched #endif";
        }
        failf((Context_conflict1 *)ctx,"%s",pcVar23);
LAB_0012f605:
        bVar6 = true;
        break;
      case TOKEN_INCOMPLETE_COMMENT:
        pcVar23 = "Incomplete multiline comment";
LAB_0012f6d1:
        failf((Context_conflict1 *)ctx,"%s",pcVar23);
        goto LAB_0012f6d8;
      }
      goto LAB_0012f6db;
    }
switchD_0012f1b8_caseD_11e:
    bVar6 = true;
    if (bVar26) goto LAB_0012f6db;
    switch(TVar8) {
    case TOKEN_PP_INCLUDE:
      handle_pp_include((Context_conflict1 *)ctx);
      break;
    case TOKEN_PP_LINE:
      handle_pp_line((Context_conflict1 *)ctx);
      break;
    case TOKEN_PP_DEFINE:
      pIVar2 = *(IncludeState **)(ctx + 0x120);
      if (pIVar2->pushedback == 0) {
        TVar8 = preprocessor_lexer(pIVar2);
      }
      else {
        pIVar2->pushedback = 0;
        TVar8 = pIVar2->tokenval;
      }
      if (TVar8 != TOKEN_IDENTIFIER) {
        pcVar23 = "Macro names must be identifiers";
        goto LAB_0012f6d1;
      }
      __s1 = (byte *)(**(code **)(ctx + 0x960))(pIVar2->tokenlen + 1,*(undefined8 *)(ctx + 0x970));
      if (__s1 == (byte *)0x0) {
        *(undefined4 *)(ctx + 4) = 1;
        break;
      }
      memcpy(__s1,pIVar2->token,(ulong)pIVar2->tokenlen);
      __s1[pIVar2->tokenlen] = 0;
      iVar9 = strcmp((char *)__s1,"defined");
      if (iVar9 == 0) {
        (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
        pcVar23 = "\'defined\' cannot be used as a macro name";
        goto LAB_0012f6d1;
      }
      iVar9 = strcmp((char *)__s1,"__FILE__");
      pPVar21 = ctx + 0x938;
      if (((iVar9 == 0) ||
          (iVar9 = strcmp((char *)__s1,"__LINE__"), pPVar21 = ctx + 0x940, iVar9 == 0)) &&
         (*(long *)pPVar21 != 0)) {
        failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
        free_define((Context_conflict1 *)ctx,*(Define **)pPVar21);
        *(long *)pPVar21 = 0;
      }
      pIVar2->report_whitespace = 1;
      if (pIVar2->pushedback == 0) {
        preprocessor_lexer(pIVar2);
      }
      else {
        pIVar2->pushedback = 0;
      }
      pIVar2->report_whitespace = 0;
      if (pIVar2->tokenval == 0x28) {
        pIVar22 = pIVar2;
        puVar14 = local_98;
        for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar14 = pIVar22->filename;
          pIVar22 = (IncludeState *)((long)pIVar22 + (ulong)bVar27 * -0x10 + 8);
          puVar14 = puVar14 + (ulong)bVar27 * -2 + 1;
        }
        uVar25 = 0;
        do {
          if (pIVar2->pushedback == 0) {
            TVar8 = preprocessor_lexer(pIVar2);
          }
          else {
            pIVar2->pushedback = 0;
            TVar8 = pIVar2->tokenval;
          }
          if (TVar8 != TOKEN_IDENTIFIER) break;
          if (pIVar2->pushedback == 0) {
            TVar8 = preprocessor_lexer(pIVar2);
          }
          else {
            pIVar2->pushedback = 0;
            TVar8 = pIVar2->tokenval;
          }
          uVar25 = (ulong)((int)uVar25 + 1);
        } while (TVar8 == 0x2c);
        if (pIVar2->tokenval == 0x29) {
          iVar9 = (int)uVar25;
          if (iVar9 == 0) {
            uVar25 = 0xffffffff;
            local_d8 = (void *)0x0;
LAB_0012fd45:
            if (pIVar2->pushedback == 0) {
              preprocessor_lexer(pIVar2);
            }
            else {
              pIVar2->pushedback = 0;
            }
            bVar26 = false;
          }
          else {
            local_d8 = (void *)(**(code **)(ctx + 0x960))
                                         ((long)iVar9 << 3 & 0xffffffff,*(undefined8 *)(ctx + 0x970)
                                         );
            if (local_d8 == (void *)0x0) {
              *(undefined4 *)(ctx + 4) = 1;
              bVar26 = true;
              local_d8 = (void *)0x0;
            }
            else {
              puVar14 = local_98;
              pIVar22 = pIVar2;
              for (lVar20 = 0xd; lVar20 != 0; lVar20 = lVar20 + -1) {
                pIVar22->filename = (char *)*puVar14;
                puVar14 = puVar14 + (ulong)bVar27 * -2 + 1;
                pIVar22 = (IncludeState *)((long)pIVar22 + (ulong)bVar27 * -0x10 + 8);
              }
              memset(local_d8,0,(long)iVar9 << 3);
              iVar12 = 0;
              if (0 < iVar9) {
                uVar16 = 0;
                do {
                  if (pIVar2->pushedback == 0) {
                    preprocessor_lexer(pIVar2);
                  }
                  else {
                    pIVar2->pushedback = 0;
                  }
                  if (pIVar2->tokenval != TOKEN_IDENTIFIER) {
                    __assert_fail("state->tokenval == TOKEN_IDENTIFIER",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                  ,0x3ff,"void handle_pp_define(Context *)");
                  }
                  __dest = (void *)(**(code **)(ctx + 0x960))
                                             (pIVar2->tokenlen + 1,*(undefined8 *)(ctx + 0x970));
                  if (__dest == (void *)0x0) {
                    *(undefined4 *)(ctx + 4) = 1;
                  }
                  else {
                    memcpy(__dest,pIVar2->token,(ulong)pIVar2->tokenlen);
                    *(undefined1 *)((long)__dest + (ulong)pIVar2->tokenlen) = 0;
                    *(void **)((long)local_d8 + uVar16 * 8) = __dest;
                    if ((long)uVar16 < (long)(iVar9 + -1)) {
                      if (pIVar2->pushedback == 0) {
                        preprocessor_lexer(pIVar2);
                      }
                      else {
                        pIVar2->pushedback = 0;
                      }
                      if (pIVar2->tokenval != 0x2c) {
                        __assert_fail("state->tokenval == ((Token) \',\')",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x40c,"void handle_pp_define(Context *)");
                      }
                    }
                  }
                  uVar17 = uVar16;
                } while ((__dest != (void *)0x0) &&
                        (uVar16 = uVar16 + 1, uVar17 = uVar25, uVar25 != uVar16));
                iVar12 = (int)uVar17;
              }
              if (iVar12 == iVar9) {
                if (pIVar2->pushedback == 0) {
                  preprocessor_lexer(pIVar2);
                }
                else {
                  pIVar2->pushedback = 0;
                }
                bVar26 = false;
                if (pIVar2->tokenval != 0x29) {
                  __assert_fail("state->tokenval == ((Token) \')\')",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                ,0x417,"void handle_pp_define(Context *)");
                }
              }
              else {
                bVar26 = true;
                if (*(int *)(ctx + 4) == 0) {
                  __assert_fail("ctx->out_of_memory",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                ,0x412,"void handle_pp_define(Context *)");
                }
              }
              if (iVar12 == iVar9) goto LAB_0012fd45;
            }
          }
        }
        else {
          failf((Context_conflict1 *)ctx,"%s","syntax error in macro parameter list");
          bVar26 = true;
          local_d8 = (void *)0x0;
        }
        iVar9 = (int)uVar25;
        bVar6 = true;
        if (!bVar26) {
          if (bVar26) goto LAB_0012f6db;
          goto LAB_0012f9fa;
        }
        pcVar23 = (char *)0x0;
      }
      else {
        if (pIVar2->tokenval == 0x20) {
          if (pIVar2->pushedback == 0) {
            preprocessor_lexer(pIVar2);
          }
          else {
            pIVar2->pushedback = 0;
          }
        }
        iVar9 = 0;
        local_d8 = (void *)0x0;
LAB_0012f9fa:
        if (pIVar2->pushedback != 0) {
LAB_0012fe19:
          __assert_fail("!state->pushedback",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x2d5,"void pushback(IncludeState *)");
        }
        pIVar2->pushedback = 1;
        buffer = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
        pIVar2->report_whitespace = 1;
        bVar6 = true;
        do {
          if (*(int *)(ctx + 4) != 0) break;
          if (pIVar2->pushedback == 0) {
            TVar8 = preprocessor_lexer(pIVar2);
          }
          else {
            pIVar2->pushedback = 0;
            TVar8 = pIVar2->tokenval;
          }
          if ((int)TVar8 < 0x11d) {
            if (TVar8 == 10) goto LAB_0012fab6;
            if (TVar8 != 0x20) goto LAB_0012fabb;
            sVar13 = buffer_size(buffer);
            if (sVar13 == 0) {
              __assert_fail("buffer_size(buffer) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x432,"void handle_pp_define(Context *)");
            }
            sVar13 = 1;
            pcVar23 = " ";
LAB_0012fac7:
            buffer_append(buffer,pcVar23,sVar13);
            bVar6 = true;
          }
          else {
            if ((TVar8 != TOKEN_INCOMPLETE_COMMENT) && (TVar8 != TOKEN_EOI)) {
LAB_0012fabb:
              pcVar23 = pIVar2->token;
              sVar13 = (size_t)pIVar2->tokenlen;
              goto LAB_0012fac7;
            }
            if (pIVar2->pushedback != 0) goto LAB_0012fe19;
            pIVar2->pushedback = 1;
LAB_0012fab6:
            bVar6 = false;
          }
        } while (bVar6);
        pIVar2->report_whitespace = 0;
        sVar13 = buffer_size(buffer);
        if (*(int *)(ctx + 4) == 0) {
          pcVar23 = buffer_flatten(buffer);
        }
        else {
          pcVar23 = (char *)0x0;
        }
        buffer_destroy(buffer);
        if (*(int *)(ctx + 4) == 0) {
          uVar25 = sVar13 + 1;
          bVar26 = false;
          if (((2 < uVar25) && (*pcVar23 == '#')) && (bVar26 = false, pcVar23[1] == '#')) {
            uVar25 = sVar13 - 1;
            memmove(pcVar23,pcVar23 + 2,uVar25);
            bVar26 = true;
          }
          if (2 < uVar25) {
            cVar1 = pcVar23[uVar25 - 2];
            pcVar18 = pcVar23 + (uVar25 - 3);
            if (cVar1 != ' ') {
              pcVar18 = pcVar23 + (uVar25 - 2);
            }
            if (((uVar25 - 4 < 0xfffffffffffffffd) || (cVar1 != ' ')) &&
               ((*pcVar18 == '#' && (pcVar18[-1] == '#')))) {
              pcVar18[-1] = '\0';
              bVar26 = true;
            }
          }
          if (bVar26) {
            failf((Context_conflict1 *)ctx,"%s",
                  "\'##\' cannot appear at either end of a macro expansion");
          }
          if (bVar6) {
            __assert_fail("done",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x461,"void handle_pp_define(Context *)");
          }
          bVar7 = *__s1;
          if (bVar7 == 0) {
            uVar25 = 5;
          }
          else {
            uVar24 = 0x1505;
            pbVar19 = __s1;
            do {
              pbVar19 = pbVar19 + 1;
              uVar24 = (uint)bVar7 ^ uVar24 * 0x21;
              bVar7 = *pbVar19;
            } while (bVar7 != 0);
            uVar25 = (ulong)(uVar24 & 0xff);
          }
          for (puVar14 = *(undefined8 **)(ctx + uVar25 * 8 + 0x130); puVar14 != (undefined8 *)0x0;
              puVar14 = (undefined8 *)puVar14[5]) {
            iVar12 = strcmp((char *)*puVar14,(char *)__s1);
            if (iVar12 == 0) {
              failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
              goto LAB_0012fd75;
            }
          }
          puVar14 = *(undefined8 **)(ctx + 0x930);
          if (puVar14 == (undefined8 *)0x0) {
            puVar14 = (undefined8 *)(**(code **)(ctx + 0x960))(0x30,*(undefined8 *)(ctx + 0x970));
            if (puVar14 == (undefined8 *)0x0) {
              *(undefined4 *)(ctx + 4) = 1;
            }
          }
          else {
            *(undefined8 *)(ctx + 0x930) = puVar14[5];
          }
          if (puVar14 != (undefined8 *)0x0) {
            *puVar14 = 0;
            puVar14[1] = 0;
            puVar14[2] = 0;
            puVar14[3] = 0;
            puVar14[4] = 0;
            puVar14[5] = 0;
            puVar14[1] = pcVar23;
            puVar14[2] = 0;
            *puVar14 = __s1;
            puVar14[3] = local_d8;
            *(int *)(puVar14 + 4) = iVar9;
            puVar14[5] = *(undefined8 *)(ctx + uVar25 * 8 + 0x130);
            *(undefined8 **)(ctx + uVar25 * 8 + 0x130) = puVar14;
            goto LAB_0012f605;
          }
        }
      }
LAB_0012fd75:
      (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
      (**(code **)(ctx + 0x968))(pcVar23,*(undefined8 *)(ctx + 0x970));
      if ((local_d8 != (void *)0x0) && (iVar9 != 0)) {
        lVar20 = (long)iVar9;
        do {
          (**(code **)(ctx + 0x968))
                    (*(undefined8 *)((long)local_d8 + lVar20 * 8 + -8),*(undefined8 *)(ctx + 0x970))
          ;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      (**(code **)(ctx + 0x968))(local_d8,*(undefined8 *)(ctx + 0x970));
      break;
    case TOKEN_PP_UNDEF:
      handle_pp_undef((Context_conflict1 *)ctx);
      break;
    case TOKEN_PP_IF:
    case TOKEN_PP_IFDEF:
    case TOKEN_PP_IFNDEF:
    case TOKEN_PP_ELSE:
    case TOKEN_PP_ELIF:
    case TOKEN_PP_ENDIF:
      goto switchD_0012f184_caseD_124;
    case TOKEN_PP_ERROR:
      pIVar2 = *(IncludeState **)(ctx + 0x120);
      *(undefined4 *)(ctx + 0xb) = 0x726f72;
      *(undefined4 *)__s = 0x72726523;
      pIVar2->report_whitespace = 1;
      bVar6 = false;
      uVar24 = 0xf9;
      pPVar21 = ctx + 0xe;
      do {
        if (pIVar2->pushedback == 0) {
          TVar8 = preprocessor_lexer(pIVar2);
        }
        else {
          pIVar2->pushedback = 0;
          TVar8 = pIVar2->tokenval;
        }
        if ((int)TVar8 < 0x11d) {
          if (TVar8 == 10) {
            pIVar2->line = pIVar2->line - 1;
LAB_0012f473:
            if (pIVar2->pushedback != 0) goto LAB_0012fe19;
            pIVar2->pushedback = 1;
            bVar6 = true;
          }
          else {
            if (TVar8 != 0x20) goto LAB_0012f443;
            if (uVar24 == 0) {
              uVar24 = 0;
            }
            else {
              *pPVar21 = (Preprocessor)0x20;
              pPVar21 = pPVar21 + 1;
              uVar24 = uVar24 - 1;
            }
          }
        }
        else {
          if ((TVar8 == TOKEN_EOI) || (TVar8 == TOKEN_INCOMPLETE_COMMENT)) goto LAB_0012f473;
LAB_0012f443:
          uVar10 = pIVar2->tokenlen;
          if ((int)uVar24 < (int)pIVar2->tokenlen) {
            uVar10 = uVar24;
          }
          if (uVar10 != 0) {
            memcpy(pPVar21,pIVar2->token,(long)(int)uVar10);
          }
          pPVar21 = pPVar21 + (int)uVar10;
          uVar24 = uVar24 - uVar10;
        }
      } while (!bVar6);
      *pPVar21 = (Preprocessor)0x0;
      pIVar2->report_whitespace = 0;
      *(undefined4 *)ctx = 1;
      goto LAB_0012f605;
    case TOKEN_PP_PRAGMA:
      uVar11 = 1;
LAB_0012f4f3:
      *(undefined4 *)(ctx + 0x110) = uVar11;
      goto switchD_0012f184_caseD_124;
    default:
      if (TVar8 == 10) {
        uVar11 = 0;
        if (*(int *)(ctx + 0x110) == 0) goto LAB_0012f6db;
        goto LAB_0012f4f3;
      }
      if (TVar8 == TOKEN_IDENTIFIER) {
        iVar9 = handle_pp_identifier((Context_conflict1 *)ctx);
        bVar6 = true;
        if (iVar9 != 0) goto LAB_0012f6db;
      }
switchD_0012f184_caseD_124:
      *token = TVar8;
      *len = pIVar2->tokenlen;
      local_c0 = pIVar2->token;
      bVar6 = false;
      goto LAB_0012f6db;
    }
LAB_0012f6d8:
    bVar6 = true;
LAB_0012f6db:
    if (!bVar6) {
      return local_c0;
    }
  } while( true );
}

Assistant:

const char *preprocessor_nexttoken(Preprocessor *ctx, unsigned int *len,
                                   Token *token)
{
    const char *retval = _preprocessor_nexttoken(ctx, len, token);
    print_debug_token(retval, *len, *token);
    return retval;
}